

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O2

cram_codec *
cram_encoder_init(cram_encoding codec,cram_stats *st,cram_external_type option,void *dat,int version
                 )

{
  FILE *__stream;
  cram_codec *pcVar1;
  char *pcVar2;
  
  __stream = _stderr;
  if ((st == (cram_stats *)0x0) || (st->nvals != 0)) {
    if ((0x385UL >> ((ulong)codec & 0x3f) & 1) != 0) {
      pcVar2 = codec2str(codec);
      fprintf(__stream,"Unimplemented codec of type %s\n",pcVar2);
      abort();
    }
    pcVar1 = (*encode_init[codec])(st,option,dat,version);
    if (pcVar1 != (cram_codec *)0x0) {
      pcVar1->out = (cram_block *)0x0;
      return pcVar1;
    }
  }
  return (cram_codec *)0x0;
}

Assistant:

cram_codec *cram_encoder_init(enum cram_encoding codec,
			      cram_stats *st,
			      enum cram_external_type option,
			      void *dat,
			      int version) {
    if (st && !st->nvals)
	return NULL;

    if (encode_init[codec]) {
	cram_codec *r;
	if ((r = encode_init[codec](st, option, dat, version)))
	    r->out = NULL;
	return r;
    } else {
	fprintf(stderr, "Unimplemented codec of type %s\n", codec2str(codec));
	abort();
    }
}